

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O0

_Bool observe_kill_move(wchar_t y,wchar_t x,wchar_t d,uint8_t a,wchar_t c,_Bool flag)

{
  ushort uVar1;
  short sVar2;
  wchar_t x_00;
  wchar_t y_00;
  bool bVar3;
  chunk_conflict *c_00;
  monster_race *pmVar4;
  _Bool _Var5;
  wchar_t wVar6;
  uint uVar7;
  borg_kill *pbVar8;
  loc_conflict grid;
  monster *pmVar9;
  char *pcVar10;
  _Bool flicker;
  monster_race *r_ptr;
  borg_kill *kill;
  uint r_idx;
  wchar_t oy;
  wchar_t ox;
  wchar_t z;
  wchar_t i;
  _Bool flag_local;
  wchar_t c_local;
  uint8_t a_local;
  wchar_t d_local;
  wchar_t x_local;
  wchar_t y_local;
  
  bVar3 = false;
  ox = L'\x01';
  c_local = d;
  do {
    if (borg_kills_nxt <= ox) {
      return false;
    }
    pbVar8 = borg_kills + ox;
    if ((pbVar8->r_idx != 0) && ((pbVar8->seen & 1U) == 0)) {
      x_00 = (pbVar8->pos).x;
      y_00 = (pbVar8->pos).y;
      wVar6 = borg_distance(y_00,x_00,y,x);
      pmVar4 = r_info;
      uVar1 = pbVar8->r_idx;
      _Var5 = flag_has_dbg(r_info[uVar1].flags,0xb,1,"r_ptr->flags","RF_UNIQUE");
      c_00 = cave;
      if (_Var5) {
        c_local = c_local << 1;
      }
      if (wVar6 <= c_local) {
        sVar2 = pbVar8->m_idx;
        grid = (loc_conflict)loc(x,y);
        pmVar9 = square_monster((chunk *)c_00,grid);
        if ((((int)sVar2 == pmVar9->midx) && ((flag || (wVar6 <= pbVar8->moves / 10 + L'\x01')))) &&
           ((borg.trait[0x78] != 0 || (c == pmVar4[uVar1].d_char)))) {
          if ((((a == pmVar4[uVar1].d_attr) && (borg.trait[0x78] == 0)) ||
              (_Var5 = flag_has_dbg(pmVar4[uVar1].flags,0xb,10,"r_ptr->flags","RF_ATTR_MULTI"),
              _Var5)) ||
             (_Var5 = flag_has_dbg(pmVar4[uVar1].flags,0xb,9,"r_ptr->flags","RF_ATTR_CLEAR"), _Var5)
             ) {
LAB_00297813:
            if (wVar6 != L'\0') {
              borg_grids[(pbVar8->pos).y][(pbVar8->pos).x].kill = '\0';
              pbVar8->ox = (uint8_t)(pbVar8->pos).x;
              pbVar8->oy = (uint8_t)(pbVar8->pos).y;
              (pbVar8->pos).x = x;
              (pbVar8->pos).y = y;
              borg_grids[(pbVar8->pos).y][(pbVar8->pos).x].kill = (uint8_t)ox;
              pcVar10 = borg_race_name((uint)pbVar8->r_idx);
              pcVar10 = format("# Tracking a monster \'%s\' at (%d,%d) from (%d,%d)",pcVar10,
                               (ulong)(uint)(pbVar8->pos).y,(ulong)(uint)(pbVar8->pos).x,
                               (ulong)(uint)y_00,(ulong)(uint)x_00);
              borg_note(pcVar10);
              borg_danger_wipe = true;
              if ((((borg.trait[0x25] == 0) && (borg.goal.type == 1)) &&
                  (((uint)borg_flow_y[0] == (pbVar8->pos).y &&
                   ((uint)borg_flow_x[0] == (pbVar8->pos).x)))) ||
                 ((borg.goal.type == 2 && ((borg.munchkin_mode & 1U) != 0)))) {
                borg.goal.type = 0;
              }
            }
            pbVar8->when = borg_t;
            if (pbVar8->r_idx == borg_morgoth_id) {
              borg_t_morgoth = borg_t;
            }
            if (bVar3) {
              borg_update_kill_new(ox);
            }
            borg_update_kill_old(ox);
            pbVar8->seen = true;
            return true;
          }
          if (((flag) && ((pbVar8->known & 1U) == 0)) &&
             (uVar7 = borg_guess_race(a,c,true,y,x), uVar7 != 0)) {
            pcVar10 = format("# Flickering monster \'%s\' at (%d,%d)",r_info[uVar7].name,
                             (ulong)(uint)y,(ulong)(uint)x);
            borg_note(pcVar10);
            pcVar10 = borg_race_name((uint)pbVar8->r_idx);
            pcVar10 = format("# Converting a monster \'%s\' at (%d,%d)",pcVar10,
                             (ulong)(uint)(pbVar8->pos).y,(ulong)(uint)(pbVar8->pos).x);
            borg_note(pcVar10);
            pbVar8->r_idx = (uint16_t)uVar7;
            bVar3 = true;
            borg_danger_wipe = true;
            borg.goal.type = 0;
            goto LAB_00297813;
          }
        }
      }
    }
    ox = ox + L'\x01';
  } while( true );
}

Assistant:

bool observe_kill_move(int y, int x, int d, uint8_t a, wchar_t c, bool flag)
{
    int                  i, z, ox, oy;
    unsigned int         r_idx;
    borg_kill           *kill;
    struct monster_race *r_ptr;

    bool flicker = false;

    /* Look at the monsters */
    for (i = 1; i < borg_kills_nxt; i++) {
        kill = &borg_kills[i];

        /* Skip dead monsters */
        if (!kill->r_idx)
            continue;

        /* Skip assigned monsters */
        if (kill->seen)
            continue;

        /* Old location */
        ox = kill->pos.x;
        oy = kill->pos.y;

        /* Calculate distance */
        z = borg_distance(oy, ox, y, x);

        /* Access the monster race */
        r_ptr = &r_info[kill->r_idx];

        /* Double the distance for uniques so the borg does not create 2 of the
         * same unique monster on the level */
        if (rf_has(r_ptr->flags, RF_UNIQUE))
            d = d * 2;

        /* Verify distance */
        if (z > d)
            continue;

        /* Verify that we are looking at the right one */
        if (kill->m_idx != square_monster(cave, loc(x, y))->midx)
            continue;

        /* Verify "reasonable" motion, if allowed */
        if (!flag && (z > (kill->moves / 10) + 1))
            continue;

        /* Verify matching char so long as not hallucinating */
        if (!borg.trait[BI_ISIMAGE] && c != r_ptr->d_char)
            continue;

        /* Verify matching attr so long as not hallucinating */
        if (a != r_ptr->d_attr || borg.trait[BI_ISIMAGE]) {
            /* Require matching attr (for normal monsters) */
            if (!rf_has(r_ptr->flags, RF_ATTR_MULTI)
                && !rf_has(r_ptr->flags, RF_ATTR_CLEAR)) {
                /* Require flag */
                if (!flag)
                    continue;

                /* Never flicker known monsters */
                if (kill->known)
                    continue;

                /* Find a multi-hued monster */
                r_idx = borg_guess_race(a, c, true, y, x);

                /* Handle failure */
                if (!r_idx)
                    continue;

                /* Note */
                borg_note(format("# Flickering monster '%s' at (%d,%d)",
                    (r_info[r_idx].name), y, x));

                /* Note */
                borg_note(format("# Converting a monster '%s' at (%d,%d)",
                    borg_race_name(kill->r_idx), kill->pos.y, kill->pos.x));

                /* Change the race */
                kill->r_idx = r_idx;

                /* Monster flickers */
                flicker = true;

                /* Recalculate danger */
                borg_danger_wipe = true;

                /* Clear monster flow goals */
                borg.goal.type = 0;
            }
        }

        /* Actual movement */
        if (z) {

            /* Update the grids */
            borg_grids[kill->pos.y][kill->pos.x].kill = 0;

            /* Save the old Location */
            kill->ox = kill->pos.x;
            kill->oy = kill->pos.y;

            /* Save the Location */
            kill->pos.x = x;
            kill->pos.y = y;

            /* Update the grids */
            borg_grids[kill->pos.y][kill->pos.x].kill = i;

            /* Note */
            borg_note(
                format("# Tracking a monster '%s' at (%d,%d) from (%d,%d)",
                    borg_race_name(kill->r_idx), kill->pos.y, kill->pos.x, oy, ox));

            /* Recalculate danger */
            borg_danger_wipe = true;

            /* Clear goals */
            if ((!borg.trait[BI_ESP] && borg.goal.type == GOAL_KILL
                    && (borg_flow_y[0] == kill->pos.y
                        && borg_flow_x[0] == kill->pos.x))
                || (borg.goal.type == GOAL_TAKE && borg.munchkin_mode))
                borg.goal.type = 0;
        }

        /* Note when last seen */
        kill->when = borg_t;

        /* Mark the Morgoth time stamp if needed */
        if (kill->r_idx == borg_morgoth_id)
            borg_t_morgoth = borg_t;

        /* Monster flickered */
        if (flicker) {
            /* Update the monster */
            borg_update_kill_new(i);
        }

        /* Update the monster */
        borg_update_kill_old(i);

        /* Mark as seen */
        kill->seen = true;

        /* Done */
        return true;
    }

    /* Oops */
    return false;
}